

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O0

JavascriptBigInt * Js::JavascriptBigInt::Sub(JavascriptBigInt *pbi1,JavascriptBigInt *pbi2)

{
  bool bVar1;
  int iVar2;
  ScriptContext *scriptContext;
  JavascriptBigInt *pbi2_local;
  JavascriptBigInt *pbi1_local;
  
  bVar1 = IsZero(pbi1);
  if (bVar1) {
    pbi2->m_isNegative = (Type)((pbi2->m_isNegative ^ 0xffU) & 1);
    pbi1_local = pbi2;
  }
  else {
    bVar1 = IsZero(pbi2);
    pbi1_local = pbi1;
    if (!bVar1) {
      if ((pbi2->m_isNegative & 1U) == 0) {
        if ((pbi1->m_isNegative & 1U) == 0) {
          iVar2 = CompareAbsolute(pbi1,pbi2);
          if (iVar2 == 0) {
            scriptContext = RecyclableObject::GetScriptContext(&pbi1->super_RecyclableObject);
            pbi1_local = CreateZero(scriptContext);
          }
          else if (iVar2 == 1) {
            SubAbsolute(pbi1,pbi2);
          }
          else {
            pbi2->m_isNegative = true;
            SubAbsolute(pbi2,pbi1);
            pbi1_local = pbi2;
          }
        }
        else if (pbi1->m_length < pbi2->m_length) {
          AddAbsolute(pbi2,pbi1);
          pbi1_local = pbi2;
        }
        else {
          AddAbsolute(pbi1,pbi2);
        }
      }
      else {
        pbi2->m_isNegative = false;
        pbi1_local = Add(pbi1,pbi2);
      }
    }
  }
  return pbi1_local;
}

Assistant:

JavascriptBigInt * JavascriptBigInt::Sub(JavascriptBigInt * pbi1, JavascriptBigInt * pbi2)
    {
        if (JavascriptBigInt::IsZero(pbi1))
        {
            pbi2->m_isNegative = !pbi2->m_isNegative;
            return pbi2;
        }
        if (JavascriptBigInt::IsZero(pbi2))
        {
            return pbi1;
        }

        if (pbi2->m_isNegative)
        {
            pbi2->m_isNegative = false;
            return JavascriptBigInt::Add(pbi1, pbi2);// a-(-b)=a+b
        }

        if (pbi1->m_isNegative) // -a-b=-(a+b)
        {
            if (pbi1->m_length >= pbi2->m_length)
            {
                JavascriptBigInt::AddAbsolute(pbi1, pbi2);
                return pbi1;
            }
            JavascriptBigInt::AddAbsolute(pbi2, pbi1);
            return pbi2;
        }
        else // both positive 
        {
            switch (pbi1->CompareAbsolute(pbi2))
            {
            case 0: // a -a = 0
                return JavascriptBigInt::CreateZero(pbi1->GetScriptContext());
            case 1: 
                JavascriptBigInt::SubAbsolute(pbi1, pbi2); // a - b > 0
                return pbi1;
            default:
                pbi2->m_isNegative = true;
                JavascriptBigInt::SubAbsolute(pbi2, pbi1); // a - b = - (b-a) < 0
                return pbi2;
            }
        }
    }